

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

wchar_t initialize_summary(player *p,equippable_summary **s)

{
  size_t len;
  loc grid;
  loc grid_00;
  player *ppVar1;
  wchar_t wVar2;
  equippable_summary *peVar3;
  ui_entry_iterator *i;
  ui_entry **ppuVar4;
  wchar_t **ppwVar5;
  wchar_t *pwVar6;
  ui_entry *puVar7;
  equippable_expr *peVar8;
  equippable_expr_class *peVar9;
  equippable_arranger *peVar10;
  object *poVar11;
  store *psVar12;
  equippable *peVar13;
  int *piVar14;
  long lVar15;
  wchar_t wVar16;
  ulong uVar17;
  long lVar18;
  prop_category *ppVar19;
  long lVar20;
  void *pvVar21;
  wchar_t count;
  void *local_d8;
  wchar_t a;
  player *local_c8;
  wchar_t v;
  prop_category *local_b8;
  long local_b0;
  int local_a4;
  cached_player_data *pcache;
  obj_visitor_data visitor;
  char *test_categories [2];
  _func_void_ui_entry_combiner_state_ptr *local_68;
  add_obj_to_summary_closure add_obj_data;
  
  peVar3 = the_summary;
  local_c8 = p;
  if (the_summary != (equippable_summary *)0x0) goto LAB_001d6f04;
  peVar3 = (equippable_summary *)mem_alloc(0x200);
  the_summary = peVar3;
  peVar3->items = (equippable *)0x0;
  peVar3->nitems = L'\0';
  peVar3->nalloc = L'\0';
  peVar3->p_and_eq_auxvals = (int *)0x0;
  peVar3->dlg_trans_msg = (char *)0x0;
  peVar3->sorted_indices = (int *)0x0;
  peVar3->p_and_eq_vals = (int *)0x0;
  peVar3->stores = EQUIPPABLE_NO_STORE;
  peVar3->ifirst = L'\0';
  peVar3->indinc = L'\x01';
  peVar3->iview = L'\0';
  peVar3->npage = L'\0';
  peVar3->nshortnm = L'\0';
  peVar3->nproplab = L'\x02';
  peVar3->irow_combined_equip = L'\x03';
  peVar3->icol_name = L'\x04';
  peVar3->term_ncol = L'\xffffffff';
  peVar3->term_nrow = L'\xffffffff';
  peVar3->nprop = L'\0';
  test_categories[0] = "EQUIPCMP_SCREEN";
  lVar18 = 0;
  while (lVar18 != 5) {
    test_categories[1] = (char *)(&DAT_00285ae0)[lVar18];
    i = initialize_ui_entry_iterator(check_for_two_categories,test_categories,test_categories[1]);
    wVar2 = count_ui_entry_iterator(i);
    peVar3 = the_summary;
    the_summary->nprop = the_summary->nprop + wVar2;
    peVar3->propcats[lVar18].n = wVar2;
    if (lVar18 == 0) {
      wVar16 = L'\0';
    }
    else {
      wVar16 = peVar3->propcats[lVar18 + -1].n + peVar3->propcats[lVar18 + -1].off;
    }
    peVar3->propcats[lVar18].off = wVar16;
    len = (long)wVar2 * 8;
    local_d8 = (void *)lVar18;
    ppuVar4 = (ui_entry **)mem_alloc(len);
    the_summary->propcats[lVar18].entries = ppuVar4;
    ppwVar5 = (wchar_t **)mem_alloc(len);
    peVar3 = the_summary;
    the_summary->propcats[lVar18].labels = ppwVar5;
    pwVar6 = (wchar_t *)mem_alloc(((long)peVar3->nproplab + 1) * (long)wVar2 * 4);
    the_summary->propcats[lVar18].label_buffer = pwVar6;
    if (wVar2 < L'\x01') {
      wVar2 = L'\0';
    }
    for (uVar17 = 0; (uint)wVar2 != uVar17; uVar17 = uVar17 + 1) {
      puVar7 = advance_ui_entry_iterator(i);
      peVar3 = the_summary;
      the_summary->propcats[lVar18].entries[uVar17] = puVar7;
      peVar3->propcats[lVar18].labels[uVar17] =
           peVar3->propcats[lVar18].label_buffer + (long)(int)uVar17 * ((long)peVar3->nproplab + 1);
      get_ui_entry_label(puVar7,the_summary->nproplab + L'\x01',true,
                         the_summary->propcats[lVar18].labels[uVar17]);
    }
    release_ui_entry_iterator(i);
    lVar18 = (long)local_d8 + 1;
  }
  (the_summary->easy_filt).nalloc = L'\x05';
  peVar8 = (equippable_expr *)mem_alloc(0x78);
  peVar3 = the_summary;
  (the_summary->easy_filt).v = peVar8;
  switch(peVar3->stores) {
  case EQUIPPABLE_NO_STORE:
    (peVar3->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar3->easy_filt).nv = L'\x01';
    (peVar8->s).func = sel_exclude_src;
    goto LAB_001d6dfd;
  case EQUIPPABLE_ONLY_STORE:
    (peVar3->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar3->easy_filt).nv = L'\x01';
    (peVar8->s).func = sel_only_src;
LAB_001d6dfd:
    peVar3 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    peVar8 = (peVar3->easy_filt).v;
    peVar8->c = EQUIP_EXPR_SELECTOR;
    break;
  case EQUIPPABLE_YES_STORE:
    (peVar3->easy_filt).simple = EQUIP_EXPR_TERMINATOR;
    (peVar3->easy_filt).nv = L'\0';
    break;
  case EQUIPPABLE_ONLY_CARRIED:
    (peVar3->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar3->easy_filt).nv = L'\x03';
    (peVar8->s).func = sel_exclude_src;
    peVar3 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    peVar8 = (peVar3->easy_filt).v;
    peVar8->c = EQUIP_EXPR_SELECTOR;
    peVar8[1].s.func = sel_exclude_src;
    peVar8[1].s.ex.src = EQUIP_SOURCE_HOME;
    peVar8 = (peVar3->easy_filt).v;
    peVar8[1].c = EQUIP_EXPR_SELECTOR;
    peVar8[2].s.func = sel_exclude_src;
    peVar8[2].s.ex.src = EQUIP_SOURCE_FLOOR;
    peVar8 = (peVar3->easy_filt).v;
    peVar8[2].c = EQUIP_EXPR_SELECTOR;
  }
  lVar18 = (long)(peVar3->easy_filt).nv;
  wVar2 = (peVar3->easy_filt).nalloc;
  peVar9 = &peVar8[lVar18].c;
  for (; lVar18 < wVar2; lVar18 = lVar18 + 1) {
    *peVar9 = EQUIP_EXPR_TERMINATOR;
    peVar9 = peVar9 + 6;
  }
  (peVar3->config_filt).v = (equippable_expr *)0x0;
  (peVar3->config_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar3->config_filt).nv = L'\0';
  (peVar3->config_filt).nalloc = L'\0';
  (peVar3->config_mod_filt).v = (equippable_expr *)0x0;
  (peVar3->config_mod_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar3->config_mod_filt).nv = L'\0';
  (peVar3->config_mod_filt).nalloc = L'\0';
  peVar3->config_filt_is_on = false;
  (peVar3->default_sort).nalloc = L'\x05';
  peVar10 = (equippable_arranger *)mem_alloc(0x50);
  peVar3 = the_summary;
  (the_summary->default_sort).v = peVar10;
  peVar10->func = cmp_by_slot;
  peVar10->propind = L'\0';
  peVar10[1].func = cmp_by_location;
  peVar10[1].propind = L'\0';
  peVar10[2].func = cmp_by_quality;
  peVar10[2].propind = L'\0';
  peVar10[3].func = cmp_by_short_name;
  peVar10[3].propind = L'\0';
  peVar10[4].func = (equippable_cmpfunc)0x0;
  peVar10[4].propind = L'\0';
  (peVar3->default_sort).nv = L'\x04';
  peVar3->config_sort_is_on = false;
  (peVar3->config_sort).v = (equippable_arranger *)0x0;
  (peVar3->config_sort).nv = L'\0';
  (peVar3->config_sort).nalloc = L'\0';
LAB_001d6f04:
  ppVar1 = local_c8;
  wVar2 = reconfigure_for_term_if_necessary(false,local_c8,peVar3);
  if (wVar2 == L'\0') {
    visitor.usefunc_closure = &count;
    count = L'\0';
    visitor.usefunc = count_objects;
    visitor.selfunc = select_any;
    visitor.selfunc_closure = (void *)0x0;
    apply_visitor_to_equipped(ppVar1,&visitor);
    visitor.selfunc = select_nonequipped_wearable;
    visitor.selfunc_closure = ppVar1;
    apply_visitor_to_pile(ppVar1->gear,&visitor);
    if (cave != (chunk_conflict *)0x0) {
      visitor.selfunc = select_seen_wearable;
      grid.x = (ppVar1->grid).x;
      grid.y = (ppVar1->grid).y;
      visitor.selfunc_closure = ppVar1;
      poVar11 = square_object(cave,grid);
      apply_visitor_to_pile(poVar11,&visitor);
    }
    visitor.selfunc = select_wearable;
    visitor.selfunc_closure = (void *)0x0;
    psVar12 = store_home(ppVar1);
    if (psVar12 != (store *)0x0) {
      psVar12 = store_home(ppVar1);
      apply_visitor_to_pile(psVar12->stock,&visitor);
    }
    add_obj_data.summary = the_summary;
    if (the_summary->nalloc < count) {
      mem_free(the_summary->sorted_indices);
      cleanup_summary_items(the_summary);
      mem_free(the_summary->items);
      peVar13 = (equippable *)mem_zalloc((long)count * 0x38);
      the_summary->items = peVar13;
      piVar14 = (int *)mem_alloc((long)count * 4 + 4);
      add_obj_data.summary = the_summary;
      the_summary->sorted_indices = piVar14;
      (add_obj_data.summary)->nalloc = count;
    }
    ppVar1 = local_c8;
    (add_obj_data.summary)->nitems = L'\0';
    visitor.usefunc = add_obj_to_summary;
    visitor.usefunc_closure = &add_obj_data;
    add_obj_data.p = local_c8;
    add_obj_data.src = EQUIP_SOURCE_WORN;
    visitor.selfunc = select_any;
    visitor.selfunc_closure = (void *)0x0;
    apply_visitor_to_equipped(local_c8,&visitor);
    add_obj_data.src = EQUIP_SOURCE_PACK;
    visitor.selfunc = select_nonequipped_wearable;
    visitor.selfunc_closure = ppVar1;
    apply_visitor_to_pile(ppVar1->gear,&visitor);
    if (cave != (chunk_conflict *)0x0) {
      add_obj_data.src = EQUIP_SOURCE_FLOOR;
      visitor.selfunc = select_seen_wearable;
      visitor.selfunc_closure = ppVar1;
      grid_00.x = (ppVar1->grid).x;
      grid_00.y = (ppVar1->grid).y;
      poVar11 = square_object(cave,grid_00);
      apply_visitor_to_pile(poVar11,&visitor);
    }
    add_obj_data.src = EQUIP_SOURCE_HOME;
    visitor.selfunc = select_wearable;
    visitor.selfunc_closure = (void *)0x0;
    psVar12 = store_home(ppVar1);
    if (psVar12 != (store *)0x0) {
      psVar12 = store_home(ppVar1);
      apply_visitor_to_pile(psVar12->stock,&visitor);
    }
    peVar3 = the_summary;
    if (the_summary->p_and_eq_vals == (int *)0x0) {
      piVar14 = (int *)mem_alloc((long)the_summary->nprop << 2);
      peVar3->p_and_eq_vals = piVar14;
    }
    if (peVar3->p_and_eq_auxvals == (int *)0x0) {
      piVar14 = (int *)mem_alloc((long)peVar3->nprop << 2);
      peVar3->p_and_eq_auxvals = piVar14;
    }
    pcache = (cached_player_data *)0x0;
    local_d8 = mem_alloc((long)peVar3->nprop << 4);
    local_b8 = peVar3->propcats;
    lVar18 = 0;
    while (lVar18 != 5) {
      ppVar19 = local_b8 + lVar18;
      pvVar21 = local_d8;
      local_b0 = lVar18;
      for (lVar20 = 0; lVar20 < ppVar19->n; lVar20 = lVar20 + 1) {
        puVar7 = ppVar19->entries[lVar20];
        wVar2 = get_ui_entry_renderer_index(puVar7);
        wVar2 = ui_entry_renderer_query_combiner(wVar2);
        if (wVar2 < L'\x01') {
          __assert_fail("combind > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x8dd,
                        "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                       );
        }
        ui_entry_combiner_get_funcs(wVar2,(ui_entry_combiner_funcs *)test_categories);
        compute_ui_entry_values_for_player(puVar7,local_c8,&pcache,&v,&a);
        (*(code *)test_categories[0])
                  ((ulong)_v & 0xffffffff,a,(void *)((long)ppVar19->off * 0x10 + (long)pvVar21));
        pvVar21 = (void *)((long)pvVar21 + 0x10);
      }
      lVar18 = local_b0 + 1;
    }
    release_cached_player_data(pcache);
    for (wVar2 = L'\0'; (uint)wVar2 < (uint)(local_c8->body).count; wVar2 = wVar2 + L'\x01') {
      poVar11 = slot_object(local_c8,wVar2);
      _v = (cached_object_data *)0x0;
      if (poVar11 != (object *)0x0) {
        lVar18 = 0;
        while (lVar18 != 5) {
          ppVar19 = local_b8 + lVar18;
          pvVar21 = local_d8;
          local_b0 = lVar18;
          for (lVar20 = 0; lVar20 < ppVar19->n; lVar20 = lVar20 + 1) {
            wVar16 = get_ui_entry_renderer_index(ppVar19->entries[lVar20]);
            wVar16 = ui_entry_renderer_query_combiner(wVar16);
            if (wVar16 < L'\x01') {
              __assert_fail("combind > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                            ,0x8fa,
                            "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                           );
            }
            ui_entry_combiner_get_funcs(wVar16,(ui_entry_combiner_funcs *)test_categories);
            compute_ui_entry_values_for_object
                      (ppVar19->entries[lVar20],poVar11,local_c8,(cached_object_data **)&v,&a,
                       &local_a4);
            (*(code *)test_categories[1])
                      (a,local_a4,(void *)((long)ppVar19->off * 0x10 + (long)pvVar21));
            pvVar21 = (void *)((long)pvVar21 + 0x10);
          }
          lVar18 = local_b0 + 1;
        }
        release_cached_object_data(_v);
      }
    }
    for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
      ppVar19 = local_b8 + lVar18;
      pvVar21 = local_d8;
      for (lVar20 = 0; lVar20 < ppVar19->n; lVar20 = lVar20 + 1) {
        wVar2 = get_ui_entry_renderer_index(ppVar19->entries[lVar20]);
        wVar2 = ui_entry_renderer_query_combiner(wVar2);
        if (wVar2 < L'\x01') {
          __assert_fail("combind > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x911,
                        "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                       );
        }
        ui_entry_combiner_get_funcs(wVar2,(ui_entry_combiner_funcs *)test_categories);
        (*local_68)((ui_entry_combiner_state *)((long)ppVar19->off * 0x10 + (long)pvVar21));
        lVar15 = ppVar19->off + lVar20;
        peVar3->p_and_eq_vals[lVar15] = *(int *)((long)local_d8 + lVar15 * 0x10 + 8);
        lVar15 = ppVar19->off + lVar20;
        peVar3->p_and_eq_auxvals[lVar15] = *(int *)((long)local_d8 + lVar15 * 0x10 + 0xc);
        pvVar21 = (void *)((long)pvVar21 + 0x10);
      }
    }
    mem_free(local_d8);
    filter_items(the_summary);
    sort_items(the_summary);
    peVar3 = the_summary;
    peVar3->isel0 = L'\xffffffff';
    peVar3->isel1 = L'\xffffffff';
    peVar3->work_sel = L'\xffffffff';
    wVar2 = L'\0';
  }
  else {
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

static int initialize_summary(struct player *p,
	struct equippable_summary **s)
{
	struct obj_visitor_data visitor;
	struct add_obj_to_summary_closure add_obj_data;
	int count, i;

	if (*s == NULL) {
		const char *categories[] = {
			"resistances",
			"abilities",
			"hindrances",
			"modifiers",
			"stat_modifiers"
		};
		const char *test_categories[2];

		*s = mem_alloc(sizeof(**s));
		(*s)->items = NULL;
		(*s)->sorted_indices = NULL;
		(*s)->p_and_eq_vals = NULL;
		(*s)->p_and_eq_auxvals = NULL;
		(*s)->dlg_trans_msg = NULL;
		(*s)->nitems = 0;
		(*s)->nalloc = 0;
		(*s)->stores = EQUIPPABLE_NO_STORE;
		(*s)->ifirst = 0;
		(*s)->indinc = 1;
		(*s)->iview = 0;
		(*s)->npage = 0;
		(*s)->nshortnm = 0;
		(*s)->term_ncol = -1;
		(*s)->term_nrow = -1;

		/* These are currently hardwired layout choices. */
		(*s)->nproplab = 2;
		(*s)->irow_combined_equip = (*s)->nproplab + 1;
		/*
		 * Leave room for a character (item character), a space,
		 * a character (item location code), and a space.
		 */
		(*s)->icol_name = 4;

		/*
		 * These need to be done once after the game configuration is
		 * read.
		 */
		(*s)->nprop = 0;
		test_categories[0] = "EQUIPCMP_SCREEN";
		for (i = 0; i < (int)N_ELEMENTS((*s)->propcats); ++i) {
			struct ui_entry_iterator *ui_iter;
			int n, j;

			test_categories[1] = categories[i];
			ui_iter = initialize_ui_entry_iterator(
				check_for_two_categories, test_categories,
				test_categories[1]);
			n = count_ui_entry_iterator(ui_iter);
			(*s)->nprop += n;
			(*s)->propcats[i].n = n;
			(*s)->propcats[i].off = (i == 0) ?
				0 : (*s)->propcats[i - 1].off +
				(*s)->propcats[i - 1].n;
			(*s)->propcats[i].entries = mem_alloc(n *
				sizeof(*(*s)->propcats[i].entries));
			(*s)->propcats[i].labels = mem_alloc(n *
				sizeof(*(*s)->propcats[i].labels));
			(*s)->propcats[i].label_buffer = mem_alloc(n *
				((*s)->nproplab + 1) *
				sizeof(*(*s)->propcats[i].label_buffer));
			for (j = 0; j < n; ++j) {
				struct ui_entry *entry =
					advance_ui_entry_iterator(ui_iter);

				(*s)->propcats[i].entries[j] = entry;
				(*s)->propcats[i].labels[j] =
					(*s)->propcats[i].label_buffer +
					j * ((*s)->nproplab + 1);
				get_ui_entry_label(entry,
					(*s)->nproplab + 1, true,
					(*s)->propcats[i].labels[j]);
			}
			release_ui_entry_iterator(ui_iter);
		}

		/*
		 * Start with nothing for the easy filter but set up space
		 * so it is trivial to add one term filtering on an attribute
		 * and up to three others that can filter on the source of the
		 * item.
		 */
		(*s)->easy_filt.nalloc = 5;
		(*s)->easy_filt.v = mem_alloc((*s)->easy_filt.nalloc *
			sizeof(*(*s)->easy_filt.v));
		switch ((*s)->stores) {
		case EQUIPPABLE_NO_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_ONLY_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_only_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_YES_STORE:
			/* There's no filtering to be done. */
			(*s)->easy_filt.simple = EQUIP_EXPR_TERMINATOR;
			(*s)->easy_filt.nv = 0;
			break;

		case EQUIPPABLE_ONLY_CARRIED:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 3;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[1].s.func = sel_exclude_src;
			(*s)->easy_filt.v[1].s.ex.src = EQUIP_SOURCE_HOME;
			(*s)->easy_filt.v[1].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[2].s.func = sel_exclude_src;
			(*s)->easy_filt.v[2].s.ex.src = EQUIP_SOURCE_FLOOR;
			(*s)->easy_filt.v[2].c = EQUIP_EXPR_SELECTOR;
		}

		for (i = (*s)->easy_filt.nv; i < (*s)->easy_filt.nalloc; ++i) {
			(*s)->easy_filt.v[i].c = EQUIP_EXPR_TERMINATOR;
		}

		/* Start with nothing for the specially configured filter. */
		(*s)->config_filt.v = NULL;
		(*s)->config_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_filt.nv = 0;
		(*s)->config_filt.nalloc = 0;
		(*s)->config_mod_filt.v = NULL;
		(*s)->config_mod_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_mod_filt.nv = 0;
		(*s)->config_mod_filt.nalloc = 0;
		(*s)->config_filt_is_on = false;

		/*
		 * The default sort is by equipment slot.  Any ties are
		 * resolved first by the location of the object, rough object
		 * quality, and then alphabetical order.
		 */
		(*s)->default_sort.nalloc = 5;
		(*s)->default_sort.v = mem_alloc((*s)->default_sort.nalloc *
			sizeof(*(*s)->default_sort.v));
		(*s)->default_sort.v[0].func = cmp_by_slot;
		(*s)->default_sort.v[0].propind = 0;
		(*s)->default_sort.v[1].func = cmp_by_location;
		(*s)->default_sort.v[1].propind = 0;
		(*s)->default_sort.v[2].func = cmp_by_quality;
		(*s)->default_sort.v[2].propind = 0;
		(*s)->default_sort.v[3].func = cmp_by_short_name;
		(*s)->default_sort.v[3].propind = 0;
		(*s)->default_sort.v[4].func = 0;
		(*s)->default_sort.v[4].propind = 0;
		(*s)->default_sort.nv = 4;

		/* Start with nothing for the specially configured sort. */
		(*s)->config_sort.v = NULL;
		(*s)->config_sort.nv = 0;
		(*s)->config_sort.nalloc = 0;
		(*s)->config_sort_is_on = false;
	}

	/* These need to be redone on a change to the terminal size. */
	if (reconfigure_for_term_if_necessary(false, p, *s)) {
		return 1;
	}

	/*
	 * These need to be redone for any change in the equipped items, pack,
	 * home, or stores.
	 */

	/* Count the available items to include. */
	count = 0;
	visitor.usefunc = count_objects;
	visitor.usefunc_closure = &count;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	/* Allocate storage and add the available items. */
	if (count > (*s)->nalloc) {
		mem_free((*s)->sorted_indices);
		cleanup_summary_items(*s);
		mem_free((*s)->items);
		(*s)->items = mem_zalloc(count * sizeof(*(*s)->items));
		(*s)->sorted_indices =
			mem_alloc((count + 1) * sizeof(*(*s)->sorted_indices));
		(*s)->nalloc = count;
	}
	(*s)->nitems = 0;
	visitor.usefunc = add_obj_to_summary;
	visitor.usefunc_closure = &add_obj_data;
	add_obj_data.p = p;
	add_obj_data.summary = *s;
	add_obj_data.src = EQUIP_SOURCE_WORN;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	add_obj_data.src = EQUIP_SOURCE_PACK;
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		add_obj_data.src = EQUIP_SOURCE_FLOOR;
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	add_obj_data.src = EQUIP_SOURCE_HOME;
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	compute_player_and_equipment_values(p, *s);

	/*
	 * Do an initial filtering and sorting of the items so they're ready
	 * for display.
	 */
	filter_items(*s);
	sort_items(*s);

	/* Reset selection state. */
	(*s)->isel0 = -1;
	(*s)->isel1 = -1;
	(*s)->work_sel = -1;

	return 0;
}